

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_gen.c
# Opt level: O0

yajl_gen_status yajl_gen_array_open(yajl_gen g)

{
  uint uVar1;
  code *pcVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  size_t sVar5;
  uint *in_RDI;
  uint _i;
  uint local_14;
  yajl_gen_status local_4;
  
  if (in_RDI[(ulong)in_RDI[1] + 4] == 7) {
    local_4 = yajl_gen_in_error_state;
  }
  else if (in_RDI[(ulong)in_RDI[1] + 4] == 6) {
    local_4 = yajl_gen_generation_complete;
  }
  else if ((in_RDI[(ulong)in_RDI[1] + 4] == 2) || (in_RDI[(ulong)in_RDI[1] + 4] == 1)) {
    local_4 = yajl_gen_keys_must_be_strings;
  }
  else {
    if ((in_RDI[(ulong)in_RDI[1] + 4] == 2) || (in_RDI[(ulong)in_RDI[1] + 4] == 5)) {
      (**(code **)(in_RDI + 0x84))(*(undefined8 *)(in_RDI + 0x86),",",1);
      if ((*in_RDI & 1) != 0) {
        (**(code **)(in_RDI + 0x84))(*(undefined8 *)(in_RDI + 0x86),"\n",1);
      }
    }
    else if ((in_RDI[(ulong)in_RDI[1] + 4] == 3) &&
            ((**(code **)(in_RDI + 0x84))(*(undefined8 *)(in_RDI + 0x86),":",1), (*in_RDI & 1) != 0)
            ) {
      (**(code **)(in_RDI + 0x84))(*(undefined8 *)(in_RDI + 0x86)," ",1);
    }
    if (((*in_RDI & 1) != 0) && (in_RDI[(ulong)in_RDI[1] + 4] != 3)) {
      for (local_14 = 0; local_14 < in_RDI[1]; local_14 = local_14 + 1) {
        pcVar2 = *(code **)(in_RDI + 0x84);
        uVar3 = *(undefined8 *)(in_RDI + 0x86);
        uVar4 = *(undefined8 *)(in_RDI + 2);
        sVar5 = strlen(*(char **)(in_RDI + 2));
        (*pcVar2)(uVar3,uVar4,sVar5 & 0xffffffff);
      }
    }
    uVar1 = in_RDI[1];
    in_RDI[1] = uVar1 + 1;
    if (uVar1 + 1 < 0x80) {
      in_RDI[(ulong)in_RDI[1] + 4] = 4;
      (**(code **)(in_RDI + 0x84))(*(undefined8 *)(in_RDI + 0x86),"[",1);
      if ((*in_RDI & 1) != 0) {
        (**(code **)(in_RDI + 0x84))(*(undefined8 *)(in_RDI + 0x86),"\n",1);
      }
      if (((*in_RDI & 1) != 0) && (in_RDI[(ulong)in_RDI[1] + 4] == 6)) {
        (**(code **)(in_RDI + 0x84))(*(undefined8 *)(in_RDI + 0x86),"\n",1);
      }
      local_4 = yajl_gen_status_ok;
    }
    else {
      local_4 = yajl_max_depth_exceeded;
    }
  }
  return local_4;
}

Assistant:

yajl_gen_status
yajl_gen_array_open(yajl_gen g)
{
    ENSURE_VALID_STATE; ENSURE_NOT_KEY; INSERT_SEP; INSERT_WHITESPACE;
    INCREMENT_DEPTH;
    g->state[g->depth] = yajl_gen_array_start;
    g->print(g->ctx, "[", 1);
    if ((g->flags & yajl_gen_beautify)) g->print(g->ctx, "\n", 1);
    FINAL_NEWLINE;
    return yajl_gen_status_ok;
}